

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  ushort uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong unaff_R14;
  size_t mask;
  float fVar73;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  float fVar42;
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined4 uVar82;
  undefined1 auVar83 [32];
  float fVar84;
  float fVar88;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined1 local_1675;
  uint local_1674;
  ulong *local_1670;
  ulong local_1668;
  long local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  size_t local_1630;
  RayK<4> *local_1628;
  undefined1 local_1620 [16];
  undefined1 local_1610 [16];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  long local_15a0;
  ulong *local_1598;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_1490 [16];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined4 local_13a0;
  undefined4 uStack_139c;
  undefined4 uStack_1398;
  undefined4 uStack_1394;
  undefined4 local_1390;
  undefined4 uStack_138c;
  undefined4 uStack_1388;
  undefined4 uStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined1 local_1370 [16];
  uint local_1360;
  uint uStack_135c;
  uint uStack_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  byte local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  uint uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1670 = local_11f8;
  local_1200 = root.ptr;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar111 = ZEXT3264(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar112 = ZEXT3264(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar113 = ZEXT3264(auVar45);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar71 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar84 * 0.99999964)));
  auVar114 = ZEXT3264(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar42 * 0.99999964)));
  auVar115 = ZEXT3264(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar71 * 0.99999964)));
  auVar116 = ZEXT3264(auVar45);
  fVar84 = fVar84 * 1.0000004;
  fVar42 = fVar42 * 1.0000004;
  fVar71 = fVar71 * 1.0000004;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = uVar28 ^ 0x20;
  uVar39 = uVar33 ^ 0x20;
  uVar37 = uVar35 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_1460._4_4_ = iVar1;
  local_1460._0_4_ = iVar1;
  local_1460._8_4_ = iVar1;
  local_1460._12_4_ = iVar1;
  local_1460._16_4_ = iVar1;
  local_1460._20_4_ = iVar1;
  local_1460._24_4_ = iVar1;
  local_1460._28_4_ = iVar1;
  auVar104 = ZEXT3264(local_1460);
  iVar1 = (tray->tfar).field_0.i[k];
  local_1480._4_4_ = iVar1;
  local_1480._0_4_ = iVar1;
  local_1480._8_4_ = iVar1;
  local_1480._12_4_ = iVar1;
  local_1480._16_4_ = iVar1;
  local_1480._20_4_ = iVar1;
  local_1480._24_4_ = iVar1;
  local_1480._28_4_ = iVar1;
  auVar107 = ZEXT3264(local_1480);
  local_15b8 = uVar28 >> 2;
  local_15c0 = uVar36 >> 2;
  local_15c8 = uVar33 >> 2;
  local_15d0 = uVar39 >> 2;
  local_15d8 = uVar35 >> 2;
  local_15e0 = uVar37 >> 2;
  local_1490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar72 = fVar84;
  fVar73 = fVar84;
  fVar74 = fVar84;
  fVar75 = fVar84;
  fVar76 = fVar84;
  fVar88 = fVar84;
  fVar91 = fVar42;
  fVar92 = fVar42;
  fVar93 = fVar42;
  fVar94 = fVar42;
  fVar95 = fVar42;
  fVar96 = fVar42;
  fVar97 = fVar71;
  fVar98 = fVar71;
  fVar99 = fVar71;
  fVar100 = fVar71;
  fVar101 = fVar71;
  fVar102 = fVar71;
  local_1650 = uVar36;
  local_1648 = uVar35;
  local_1640 = uVar33;
  local_1638 = uVar28;
  local_1630 = k;
  local_1628 = ray;
  local_1440 = fVar71;
  fStack_143c = fVar71;
  fStack_1438 = fVar71;
  fStack_1434 = fVar71;
  fStack_1430 = fVar71;
  fStack_142c = fVar71;
  fStack_1428 = fVar71;
  fStack_1424 = fVar71;
  local_1420 = fVar42;
  fStack_141c = fVar42;
  fStack_1418 = fVar42;
  fStack_1414 = fVar42;
  fStack_1410 = fVar42;
  fStack_140c = fVar42;
  fStack_1408 = fVar42;
  fStack_1404 = fVar42;
  local_1400 = fVar84;
  fStack_13fc = fVar84;
  fStack_13f8 = fVar84;
  fStack_13f4 = fVar84;
  fStack_13f0 = fVar84;
  fStack_13ec = fVar84;
  fStack_13e8 = fVar84;
  fStack_13e4 = fVar84;
  do {
    local_1598 = local_1670;
    if (local_1670 == &local_1200) break;
    uVar30 = local_1670[-1];
    local_1670 = local_1670 + -1;
    do {
      if ((uVar30 & 8) == 0) {
        auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar28),auVar111._0_32_);
        auVar45 = vmulps_avx512vl(auVar114._0_32_,auVar45);
        auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar33),auVar112._0_32_);
        auVar46 = vmulps_avx512vl(auVar115._0_32_,auVar46);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar35),auVar113._0_32_);
        auVar47 = vmulps_avx512vl(auVar116._0_32_,auVar46);
        auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar36),auVar111._0_32_);
        auVar46._4_4_ = fVar72 * auVar48._4_4_;
        auVar46._0_4_ = fVar84 * auVar48._0_4_;
        auVar46._8_4_ = fVar73 * auVar48._8_4_;
        auVar46._12_4_ = fVar74 * auVar48._12_4_;
        auVar46._16_4_ = fVar75 * auVar48._16_4_;
        auVar46._20_4_ = fVar76 * auVar48._20_4_;
        auVar46._24_4_ = fVar88 * auVar48._24_4_;
        auVar46._28_4_ = auVar48._28_4_;
        auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar39),auVar112._0_32_);
        auVar48._4_4_ = fVar91 * auVar49._4_4_;
        auVar48._0_4_ = fVar42 * auVar49._0_4_;
        auVar48._8_4_ = fVar92 * auVar49._8_4_;
        auVar48._12_4_ = fVar93 * auVar49._12_4_;
        auVar48._16_4_ = fVar94 * auVar49._16_4_;
        auVar48._20_4_ = fVar95 * auVar49._20_4_;
        auVar48._24_4_ = fVar96 * auVar49._24_4_;
        auVar48._28_4_ = auVar49._28_4_;
        auVar48 = vminps_avx(auVar46,auVar48);
        auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar37),auVar113._0_32_);
        auVar49._4_4_ = fVar97 * auVar46._4_4_;
        auVar49._0_4_ = fVar71 * auVar46._0_4_;
        auVar49._8_4_ = fVar98 * auVar46._8_4_;
        auVar49._12_4_ = fVar99 * auVar46._12_4_;
        auVar49._16_4_ = fVar100 * auVar46._16_4_;
        auVar49._20_4_ = fVar101 * auVar46._20_4_;
        auVar49._24_4_ = fVar102 * auVar46._24_4_;
        auVar49._28_4_ = auVar46._28_4_;
        auVar46 = vmaxps_avx(auVar47,auVar104._0_32_);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        auVar46 = vminps_avx(auVar49,auVar107._0_32_);
        auVar46 = vminps_avx(auVar48,auVar46);
        uVar17 = vcmpps_avx512vl(auVar45,auVar46,2);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar17);
      }
      if ((uVar30 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar26 = 4;
        }
        else {
          uVar29 = uVar30 & 0xfffffffffffffff0;
          lVar27 = 0;
          for (uVar30 = unaff_R14; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar26 = 0;
          for (uVar31 = unaff_R14 - 1 & unaff_R14; uVar30 = *(ulong *)(uVar29 + lVar27 * 8),
              uVar31 != 0; uVar31 = uVar31 - 1 & uVar31) {
            *local_1670 = uVar30;
            local_1670 = local_1670 + 1;
            lVar27 = 0;
            for (uVar30 = uVar31; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
          }
        }
      }
      else {
        uVar26 = 6;
      }
    } while (uVar26 == 0);
    if (uVar26 == 6) {
      local_15e8 = (ulong)((uint)uVar30 & 0xf) - 8;
      bVar40 = local_15e8 != 0;
      if (bVar40) {
        uVar30 = uVar30 & 0xfffffffffffffff0;
        local_15a8 = 0;
        do {
          lVar27 = local_15a8 * 0x90;
          local_15a0 = uVar30 + lVar27;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *(ulong *)(uVar30 + 0x40 + lVar27);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *(ulong *)(uVar30 + 0x48 + lVar27);
          uVar19 = vpcmpub_avx512vl(auVar77,auVar79,2);
          uVar82 = *(undefined4 *)(uVar30 + 0x70 + lVar27);
          auVar52._4_4_ = uVar82;
          auVar52._0_4_ = uVar82;
          auVar52._8_4_ = uVar82;
          auVar52._12_4_ = uVar82;
          auVar52._16_4_ = uVar82;
          auVar52._20_4_ = uVar82;
          auVar52._24_4_ = uVar82;
          auVar52._28_4_ = uVar82;
          uVar82 = *(undefined4 *)(uVar30 + 0x7c + lVar27);
          auVar55._4_4_ = uVar82;
          auVar55._0_4_ = uVar82;
          auVar55._8_4_ = uVar82;
          auVar55._12_4_ = uVar82;
          auVar55._16_4_ = uVar82;
          auVar55._20_4_ = uVar82;
          auVar55._24_4_ = uVar82;
          auVar55._28_4_ = uVar82;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(local_15b8 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar44);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar44 = vfmadd213ps_fma(auVar45,auVar55,auVar52);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(local_15c0 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar43);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar43 = vfmadd213ps_fma(auVar45,auVar55,auVar52);
          uVar82 = *(undefined4 *)(uVar30 + 0x74 + lVar27);
          auVar53._4_4_ = uVar82;
          auVar53._0_4_ = uVar82;
          auVar53._8_4_ = uVar82;
          auVar53._12_4_ = uVar82;
          auVar53._16_4_ = uVar82;
          auVar53._20_4_ = uVar82;
          auVar53._24_4_ = uVar82;
          auVar53._28_4_ = uVar82;
          uVar82 = *(undefined4 *)(uVar30 + 0x80 + lVar27);
          auVar56._4_4_ = uVar82;
          auVar56._0_4_ = uVar82;
          auVar56._8_4_ = uVar82;
          auVar56._12_4_ = uVar82;
          auVar56._16_4_ = uVar82;
          auVar56._20_4_ = uVar82;
          auVar56._24_4_ = uVar82;
          auVar56._28_4_ = uVar82;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_15c8 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar2);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar2 = vfmadd213ps_fma(auVar45,auVar56,auVar53);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_15d0 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar3);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar3 = vfmadd213ps_fma(auVar45,auVar56,auVar53);
          uVar82 = *(undefined4 *)(uVar30 + 0x78 + lVar27);
          auVar54._4_4_ = uVar82;
          auVar54._0_4_ = uVar82;
          auVar54._8_4_ = uVar82;
          auVar54._12_4_ = uVar82;
          auVar54._16_4_ = uVar82;
          auVar54._20_4_ = uVar82;
          auVar54._24_4_ = uVar82;
          auVar54._28_4_ = uVar82;
          uVar82 = *(undefined4 *)(uVar30 + 0x84 + lVar27);
          auVar57._4_4_ = uVar82;
          auVar57._0_4_ = uVar82;
          auVar57._8_4_ = uVar82;
          auVar57._12_4_ = uVar82;
          auVar57._16_4_ = uVar82;
          auVar57._20_4_ = uVar82;
          auVar57._24_4_ = uVar82;
          auVar57._28_4_ = uVar82;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_15d8 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar4);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar4 = vfmadd213ps_fma(auVar45,auVar57,auVar54);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_15e0 + 0x40 + local_15a0);
          auVar45 = vpmovzxbd_avx2(auVar5);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar5 = vfmadd213ps_fma(auVar45,auVar57,auVar54);
          auVar45 = vsubps_avx512vl(ZEXT1632(auVar44),auVar111._0_32_);
          auVar45 = vmulps_avx512vl(auVar114._0_32_,auVar45);
          auVar46 = vsubps_avx512vl(ZEXT1632(auVar2),auVar112._0_32_);
          auVar46 = vmulps_avx512vl(auVar115._0_32_,auVar46);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          auVar46 = vsubps_avx512vl(ZEXT1632(auVar4),auVar113._0_32_);
          auVar46 = vmulps_avx512vl(auVar116._0_32_,auVar46);
          auVar48 = vsubps_avx512vl(ZEXT1632(auVar43),auVar111._0_32_);
          auVar47._4_4_ = fVar72 * auVar48._4_4_;
          auVar47._0_4_ = fVar84 * auVar48._0_4_;
          auVar47._8_4_ = fVar73 * auVar48._8_4_;
          auVar47._12_4_ = fVar74 * auVar48._12_4_;
          auVar47._16_4_ = fVar75 * auVar48._16_4_;
          auVar47._20_4_ = fVar76 * auVar48._20_4_;
          auVar47._24_4_ = fVar88 * auVar48._24_4_;
          auVar47._28_4_ = auVar48._28_4_;
          auVar48 = vsubps_avx512vl(ZEXT1632(auVar3),auVar112._0_32_);
          auVar50._4_4_ = fVar91 * auVar48._4_4_;
          auVar50._0_4_ = fVar42 * auVar48._0_4_;
          auVar50._8_4_ = fVar92 * auVar48._8_4_;
          auVar50._12_4_ = fVar93 * auVar48._12_4_;
          auVar50._16_4_ = fVar94 * auVar48._16_4_;
          auVar50._20_4_ = fVar95 * auVar48._20_4_;
          auVar50._24_4_ = fVar96 * auVar48._24_4_;
          auVar50._28_4_ = auVar48._28_4_;
          auVar48 = vminps_avx(auVar47,auVar50);
          auVar49 = vsubps_avx512vl(ZEXT1632(auVar5),auVar113._0_32_);
          auVar51._4_4_ = fVar97 * auVar49._4_4_;
          auVar51._0_4_ = fVar71 * auVar49._0_4_;
          auVar51._8_4_ = fVar98 * auVar49._8_4_;
          auVar51._12_4_ = fVar99 * auVar49._12_4_;
          auVar51._16_4_ = fVar100 * auVar49._16_4_;
          auVar51._20_4_ = fVar101 * auVar49._20_4_;
          auVar51._24_4_ = fVar102 * auVar49._24_4_;
          auVar51._28_4_ = auVar49._28_4_;
          auVar46 = vmaxps_avx(auVar46,auVar104._0_32_);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          auVar46 = vminps_avx(auVar51,auVar107._0_32_);
          auVar46 = vminps_avx(auVar48,auVar46);
          uVar17 = vcmpps_avx512vl(auVar45,auVar46,2);
          if ((byte)((byte)uVar17 & (byte)uVar19) != 0) {
            local_15b0 = (ulong)(byte)((byte)uVar17 & (byte)uVar19);
            do {
              lVar27 = 0;
              for (uVar28 = local_15b0; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                  ) {
                lVar27 = lVar27 + 1;
              }
              uVar6 = *(ushort *)(local_15a0 + lVar27 * 8);
              uVar7 = *(ushort *)(local_15a0 + 2 + lVar27 * 8);
              local_15f0 = (ulong)*(uint *)(local_15a0 + 4 + lVar27 * 8);
              pGVar8 = (context->scene->geometries).items[*(uint *)(local_15a0 + 0x88)].ptr;
              local_1660 = *(long *)&pGVar8->field_0x58;
              lVar32 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       local_15f0;
              local_1674 = uVar7 & 0x7fff;
              uVar26 = *(uint *)(local_1660 + 4 + lVar32);
              uVar35 = (ulong)uVar26;
              uVar33 = (ulong)(uVar26 * local_1674 +
                              *(int *)(local_1660 + lVar32) + (uVar6 & 0x7fff));
              lVar27 = *(long *)&pGVar8[1].time_range.upper;
              p_Var9 = pGVar8[1].intersectionFilterN;
              auVar44 = *(undefined1 (*) [16])(lVar27 + (uVar33 + 1) * (long)p_Var9);
              auVar43 = *(undefined1 (*) [16])(lVar27 + (uVar33 + uVar35) * (long)p_Var9);
              lVar38 = uVar33 + uVar35 + 1;
              auVar2 = *(undefined1 (*) [16])(lVar27 + lVar38 * (long)p_Var9);
              uVar28 = (ulong)(-1 < (short)uVar6);
              auVar3 = *(undefined1 (*) [16])(lVar27 + (uVar33 + uVar28 + 1) * (long)p_Var9);
              lVar34 = uVar28 + lVar38;
              auVar4 = *(undefined1 (*) [16])(lVar27 + lVar34 * (long)p_Var9);
              uVar28 = 0;
              if (-1 < (short)uVar7) {
                uVar28 = uVar35;
              }
              auVar5 = *(undefined1 (*) [16])(lVar27 + (uVar33 + uVar35 + uVar28) * (long)p_Var9);
              auVar77 = *(undefined1 (*) [16])(lVar27 + (lVar38 + uVar28) * (long)p_Var9);
              auVar85._16_16_ = *(undefined1 (*) [16])(lVar27 + (uVar28 + lVar34) * (long)p_Var9);
              auVar85._0_16_ = auVar2;
              auVar13 = vunpcklps_avx(auVar44,auVar4);
              auVar79 = vunpckhps_avx(auVar44,auVar4);
              auVar80 = vunpcklps_avx(auVar3,auVar2);
              auVar3 = vunpckhps_avx(auVar3,auVar2);
              auVar14 = vunpcklps_avx(auVar79,auVar3);
              auVar15 = vunpcklps_avx(auVar13,auVar80);
              auVar3 = vunpckhps_avx(auVar13,auVar80);
              auVar13 = vunpcklps_avx(auVar43,auVar77);
              auVar79 = vunpckhps_avx(auVar43,auVar77);
              auVar80 = vunpcklps_avx(auVar2,auVar5);
              auVar5 = vunpckhps_avx(auVar2,auVar5);
              auVar79 = vunpcklps_avx(auVar79,auVar5);
              auVar16 = vunpcklps_avx(auVar13,auVar80);
              auVar5 = vunpckhps_avx(auVar13,auVar80);
              auVar61._16_16_ = auVar77;
              auVar61._0_16_ = auVar43;
              auVar59._16_16_ = auVar4;
              auVar59._0_16_ = auVar44;
              auVar45 = vunpcklps_avx(auVar59,auVar61);
              auVar58._16_16_ = auVar2;
              auVar58._0_16_ = *(undefined1 (*) [16])(lVar27 + (long)p_Var9 * uVar33);
              auVar46 = vunpcklps_avx(auVar58,auVar85);
              auVar49 = vunpcklps_avx(auVar46,auVar45);
              auVar46 = vunpckhps_avx(auVar46,auVar45);
              auVar45 = vunpckhps_avx(auVar59,auVar61);
              auVar48 = vunpckhps_avx(auVar58,auVar85);
              auVar48 = vunpcklps_avx(auVar48,auVar45);
              auVar60._16_16_ = auVar15;
              auVar60._0_16_ = auVar15;
              auVar62._16_16_ = auVar3;
              auVar62._0_16_ = auVar3;
              auVar68._16_16_ = auVar14;
              auVar68._0_16_ = auVar14;
              auVar86._16_16_ = auVar16;
              auVar86._0_16_ = auVar16;
              auVar108._16_16_ = auVar5;
              auVar108._0_16_ = auVar5;
              uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4);
              auVar109._4_4_ = uVar82;
              auVar109._0_4_ = uVar82;
              auVar109._8_4_ = uVar82;
              auVar109._12_4_ = uVar82;
              auVar109._16_4_ = uVar82;
              auVar109._20_4_ = uVar82;
              auVar109._24_4_ = uVar82;
              auVar109._28_4_ = uVar82;
              uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4 + 0x10);
              auVar110._4_4_ = uVar82;
              auVar110._0_4_ = uVar82;
              auVar110._8_4_ = uVar82;
              auVar110._12_4_ = uVar82;
              auVar110._16_4_ = uVar82;
              auVar110._20_4_ = uVar82;
              auVar110._24_4_ = uVar82;
              auVar110._28_4_ = uVar82;
              auVar47 = vbroadcastss_avx512vl
                                  (ZEXT416(*(uint *)(local_1628 + local_1630 * 4 + 0x20)));
              uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4 + 0x40);
              auVar83._4_4_ = uVar82;
              auVar83._0_4_ = uVar82;
              auVar83._8_4_ = uVar82;
              auVar83._12_4_ = uVar82;
              auVar83._16_4_ = uVar82;
              auVar83._20_4_ = uVar82;
              auVar83._24_4_ = uVar82;
              auVar83._28_4_ = uVar82;
              auVar105._16_16_ = auVar79;
              auVar105._0_16_ = auVar79;
              uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4 + 0x50);
              auVar89._4_4_ = uVar82;
              auVar89._0_4_ = uVar82;
              auVar89._8_4_ = uVar82;
              auVar89._12_4_ = uVar82;
              auVar89._16_4_ = uVar82;
              auVar89._20_4_ = uVar82;
              auVar89._24_4_ = uVar82;
              auVar89._28_4_ = uVar82;
              fVar84 = *(float *)(local_1628 + local_1630 * 4 + 0x60);
              auVar103._4_4_ = fVar84;
              auVar103._0_4_ = fVar84;
              auVar103._8_4_ = fVar84;
              auVar103._12_4_ = fVar84;
              auVar103._16_4_ = fVar84;
              auVar103._20_4_ = fVar84;
              auVar103._24_4_ = fVar84;
              auVar103._28_4_ = fVar84;
              auVar45 = vsubps_avx(auVar49,auVar109);
              auVar46 = vsubps_avx(auVar46,auVar110);
              auVar50 = vsubps_avx512vl(auVar48,auVar47);
              auVar48 = vsubps_avx(auVar60,auVar109);
              auVar49 = vsubps_avx(auVar62,auVar110);
              auVar51 = vsubps_avx512vl(auVar68,auVar47);
              auVar52 = vsubps_avx512vl(auVar86,auVar109);
              auVar53 = vsubps_avx512vl(auVar108,auVar110);
              auVar47 = vsubps_avx512vl(auVar105,auVar47);
              auVar54 = vsubps_avx512vl(auVar52,auVar45);
              auVar55 = vsubps_avx512vl(auVar53,auVar46);
              auVar56 = vsubps_avx512vl(auVar47,auVar50);
              auVar57 = vsubps_avx512vl(auVar45,auVar48);
              auVar58 = vsubps_avx512vl(auVar46,auVar49);
              auVar59 = vsubps_avx512vl(auVar50,auVar51);
              auVar60 = vsubps_avx512vl(auVar48,auVar52);
              auVar61 = vsubps_avx512vl(auVar49,auVar53);
              auVar62 = vsubps_avx512vl(auVar51,auVar47);
              auVar63 = vaddps_avx512vl(auVar52,auVar45);
              auVar64 = vaddps_avx512vl(auVar53,auVar46);
              auVar65 = vaddps_avx512vl(auVar47,auVar50);
              auVar66 = vmulps_avx512vl(auVar64,auVar56);
              auVar66 = vfmsub231ps_avx512vl(auVar66,auVar55,auVar65);
              auVar65 = vmulps_avx512vl(auVar65,auVar54);
              auVar67 = vfmsub231ps_avx512vl(auVar65,auVar56,auVar63);
              auVar65._4_4_ = auVar63._4_4_ * auVar55._4_4_;
              auVar65._0_4_ = auVar63._0_4_ * auVar55._0_4_;
              auVar65._8_4_ = auVar63._8_4_ * auVar55._8_4_;
              auVar65._12_4_ = auVar63._12_4_ * auVar55._12_4_;
              auVar65._16_4_ = auVar63._16_4_ * auVar55._16_4_;
              auVar65._20_4_ = auVar63._20_4_ * auVar55._20_4_;
              auVar65._24_4_ = auVar63._24_4_ * auVar55._24_4_;
              auVar65._28_4_ = auVar63._28_4_;
              auVar44 = vfmsub231ps_fma(auVar65,auVar54,auVar64);
              auVar87._0_4_ = auVar44._0_4_ * fVar84;
              auVar87._4_4_ = auVar44._4_4_ * fVar84;
              auVar87._8_4_ = auVar44._8_4_ * fVar84;
              auVar87._12_4_ = auVar44._12_4_ * fVar84;
              auVar87._16_4_ = fVar84 * 0.0;
              auVar87._20_4_ = fVar84 * 0.0;
              auVar87._24_4_ = fVar84 * 0.0;
              auVar87._28_4_ = 0;
              auVar63 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar67);
              auVar65 = vfmadd231ps_avx512vl(auVar63,auVar83,auVar66);
              auVar106._0_4_ = auVar45._0_4_ + auVar48._0_4_;
              auVar106._4_4_ = auVar45._4_4_ + auVar48._4_4_;
              auVar106._8_4_ = auVar45._8_4_ + auVar48._8_4_;
              auVar106._12_4_ = auVar45._12_4_ + auVar48._12_4_;
              auVar106._16_4_ = auVar45._16_4_ + auVar48._16_4_;
              auVar106._20_4_ = auVar45._20_4_ + auVar48._20_4_;
              auVar106._24_4_ = auVar45._24_4_ + auVar48._24_4_;
              auVar106._28_4_ = auVar45._28_4_ + auVar48._28_4_;
              auVar63 = vaddps_avx512vl(auVar46,auVar49);
              auVar64 = vaddps_avx512vl(auVar50,auVar51);
              auVar66 = vmulps_avx512vl(auVar63,auVar59);
              auVar67 = vfmsub231ps_avx512vl(auVar66,auVar58,auVar64);
              auVar64 = vmulps_avx512vl(auVar64,auVar57);
              auVar64 = vfmsub231ps_avx512vl(auVar64,auVar59,auVar106);
              auVar66 = vmulps_avx512vl(auVar106,auVar58);
              auVar63 = vfmsub231ps_avx512vl(auVar66,auVar57,auVar63);
              auVar66._4_4_ = auVar63._4_4_ * fVar84;
              auVar66._0_4_ = auVar63._0_4_ * fVar84;
              auVar66._8_4_ = auVar63._8_4_ * fVar84;
              auVar66._12_4_ = auVar63._12_4_ * fVar84;
              auVar66._16_4_ = auVar63._16_4_ * fVar84;
              auVar66._20_4_ = auVar63._20_4_ * fVar84;
              auVar66._24_4_ = auVar63._24_4_ * fVar84;
              auVar66._28_4_ = auVar63._28_4_;
              auVar63 = vfmadd231ps_avx512vl(auVar66,auVar89,auVar64);
              auVar66 = vfmadd231ps_avx512vl(auVar63,auVar83,auVar67);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar48 = vaddps_avx512vl(auVar48,auVar52);
              auVar49 = vaddps_avx512vl(auVar49,auVar53);
              auVar47 = vaddps_avx512vl(auVar51,auVar47);
              auVar51 = vmulps_avx512vl(auVar49,auVar62);
              auVar51 = vfmsub231ps_avx512vl(auVar51,auVar61,auVar47);
              auVar47 = vmulps_avx512vl(auVar47,auVar60);
              auVar47 = vfmsub231ps_avx512vl(auVar47,auVar62,auVar48);
              auVar67._4_4_ = auVar48._4_4_ * auVar61._4_4_;
              auVar67._0_4_ = auVar48._0_4_ * auVar61._0_4_;
              auVar67._8_4_ = auVar48._8_4_ * auVar61._8_4_;
              auVar67._12_4_ = auVar48._12_4_ * auVar61._12_4_;
              auVar67._16_4_ = auVar48._16_4_ * auVar61._16_4_;
              auVar67._20_4_ = auVar48._20_4_ * auVar61._20_4_;
              auVar67._24_4_ = auVar48._24_4_ * auVar61._24_4_;
              auVar67._28_4_ = auVar48._28_4_;
              auVar44 = vfmsub231ps_fma(auVar67,auVar60,auVar49);
              auVar48 = vmulps_avx512vl(ZEXT1632(auVar44),auVar103);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar89,auVar47);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar83,auVar51);
              auVar78._0_4_ = auVar65._0_4_ + auVar66._0_4_;
              auVar78._4_4_ = auVar65._4_4_ + auVar66._4_4_;
              auVar78._8_4_ = auVar65._8_4_ + auVar66._8_4_;
              auVar78._12_4_ = auVar65._12_4_ + auVar66._12_4_;
              auVar78._16_4_ = auVar65._16_4_ + auVar66._16_4_;
              auVar78._20_4_ = auVar65._20_4_ + auVar66._20_4_;
              auVar78._24_4_ = auVar65._24_4_ + auVar66._24_4_;
              auVar78._28_4_ = auVar65._28_4_ + auVar66._28_4_;
              local_1300 = vaddps_avx512vl(auVar48,auVar78);
              vandps_avx512vl(local_1300,auVar68);
              auVar63._8_4_ = 0x34000000;
              auVar63._0_8_ = 0x3400000034000000;
              auVar63._12_4_ = 0x34000000;
              auVar63._16_4_ = 0x34000000;
              auVar63._20_4_ = 0x34000000;
              auVar63._24_4_ = 0x34000000;
              auVar63._28_4_ = 0x34000000;
              auVar49 = vmulps_avx512vl(local_1300,auVar63);
              auVar47 = vminps_avx512vl(auVar65,auVar66);
              auVar47 = vminps_avx512vl(auVar47,auVar48);
              auVar64._8_4_ = 0x80000000;
              auVar64._0_8_ = 0x8000000080000000;
              auVar64._12_4_ = 0x80000000;
              auVar64._16_4_ = 0x80000000;
              auVar64._20_4_ = 0x80000000;
              auVar64._24_4_ = 0x80000000;
              auVar64._28_4_ = 0x80000000;
              auVar51 = vxorps_avx512vl(auVar49,auVar64);
              uVar17 = vcmpps_avx512vl(auVar47,auVar51,5);
              auVar47 = vmaxps_avx512vl(auVar65,auVar66);
              auVar48 = vmaxps_avx512vl(auVar47,auVar48);
              uVar19 = vcmpps_avx512vl(auVar48,auVar49,2);
              local_12d8 = (byte)uVar17 | (byte)uVar19;
              uVar28 = local_1638;
              k = local_1630;
              uVar33 = local_1640;
              ray = local_1628;
              uVar35 = local_1648;
              uVar36 = local_1650;
              if (local_12d8 != 0) {
                auVar48 = vmulps_avx512vl(auVar58,auVar56);
                auVar49 = vmulps_avx512vl(auVar54,auVar59);
                auVar47 = vmulps_avx512vl(auVar57,auVar55);
                auVar51 = vmulps_avx512vl(auVar61,auVar59);
                auVar52 = vmulps_avx512vl(auVar57,auVar62);
                auVar53 = vmulps_avx512vl(auVar60,auVar58);
                auVar55 = vfmsub213ps_avx512vl(auVar55,auVar59,auVar48);
                auVar56 = vfmsub213ps_avx512vl(auVar56,auVar57,auVar49);
                auVar54 = vfmsub213ps_avx512vl(auVar54,auVar58,auVar47);
                auVar63 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar51);
                auVar64 = vfmsub213ps_avx512vl(auVar60,auVar59,auVar52);
                auVar57 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar53);
                vandps_avx512vl(auVar48,auVar68);
                vandps_avx512vl(auVar51,auVar68);
                uVar29 = vcmpps_avx512vl(auVar57,auVar57,1);
                vandps_avx512vl(auVar49,auVar68);
                vandps_avx512vl(auVar52,auVar68);
                uVar31 = vcmpps_avx512vl(auVar57,auVar57,1);
                vandps_avx512vl(auVar47,auVar68);
                vandps_avx512vl(auVar53,auVar68);
                uVar18 = vcmpps_avx512vl(auVar57,auVar57,1);
                bVar41 = (bool)((byte)uVar29 & 1);
                auVar69._0_4_ =
                     (float)((uint)bVar41 * auVar55._0_4_ | (uint)!bVar41 * auVar63._0_4_);
                bVar41 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar69._4_4_ =
                     (float)((uint)bVar41 * auVar55._4_4_ | (uint)!bVar41 * auVar63._4_4_);
                bVar41 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar69._8_4_ =
                     (float)((uint)bVar41 * auVar55._8_4_ | (uint)!bVar41 * auVar63._8_4_);
                bVar41 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar69._12_4_ =
                     (float)((uint)bVar41 * auVar55._12_4_ | (uint)!bVar41 * auVar63._12_4_);
                bVar41 = (bool)((byte)(uVar29 >> 4) & 1);
                auVar69._16_4_ =
                     (float)((uint)bVar41 * auVar55._16_4_ | (uint)!bVar41 * auVar63._16_4_);
                bVar41 = (bool)((byte)(uVar29 >> 5) & 1);
                auVar69._20_4_ =
                     (float)((uint)bVar41 * auVar55._20_4_ | (uint)!bVar41 * auVar63._20_4_);
                bVar41 = (bool)((byte)(uVar29 >> 6) & 1);
                auVar69._24_4_ =
                     (float)((uint)bVar41 * auVar55._24_4_ | (uint)!bVar41 * auVar63._24_4_);
                bVar41 = SUB81(uVar29 >> 7,0);
                auVar69._28_4_ = (uint)bVar41 * auVar55._28_4_ | (uint)!bVar41 * auVar63._28_4_;
                bVar41 = (bool)((byte)uVar31 & 1);
                auVar70._0_4_ =
                     (float)((uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar64._0_4_);
                bVar41 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar70._4_4_ =
                     (float)((uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar64._4_4_);
                bVar41 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar70._8_4_ =
                     (float)((uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar64._8_4_);
                bVar41 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar70._12_4_ =
                     (float)((uint)bVar41 * auVar56._12_4_ | (uint)!bVar41 * auVar64._12_4_);
                bVar41 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar70._16_4_ =
                     (float)((uint)bVar41 * auVar56._16_4_ | (uint)!bVar41 * auVar64._16_4_);
                bVar41 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar70._20_4_ =
                     (float)((uint)bVar41 * auVar56._20_4_ | (uint)!bVar41 * auVar64._20_4_);
                bVar41 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar70._24_4_ =
                     (float)((uint)bVar41 * auVar56._24_4_ | (uint)!bVar41 * auVar64._24_4_);
                bVar41 = SUB81(uVar31 >> 7,0);
                auVar70._28_4_ = (uint)bVar41 * auVar56._28_4_ | (uint)!bVar41 * auVar64._28_4_;
                bVar41 = (bool)((byte)uVar18 & 1);
                fVar42 = (float)((uint)bVar41 * auVar54._0_4_ | (uint)!bVar41 * auVar57._0_4_);
                bVar41 = (bool)((byte)(uVar18 >> 1) & 1);
                fVar71 = (float)((uint)bVar41 * auVar54._4_4_ | (uint)!bVar41 * auVar57._4_4_);
                bVar41 = (bool)((byte)(uVar18 >> 2) & 1);
                fVar72 = (float)((uint)bVar41 * auVar54._8_4_ | (uint)!bVar41 * auVar57._8_4_);
                bVar41 = (bool)((byte)(uVar18 >> 3) & 1);
                fVar73 = (float)((uint)bVar41 * auVar54._12_4_ | (uint)!bVar41 * auVar57._12_4_);
                bVar41 = (bool)((byte)(uVar18 >> 4) & 1);
                fVar74 = (float)((uint)bVar41 * auVar54._16_4_ | (uint)!bVar41 * auVar57._16_4_);
                bVar41 = (bool)((byte)(uVar18 >> 5) & 1);
                fVar75 = (float)((uint)bVar41 * auVar54._20_4_ | (uint)!bVar41 * auVar57._20_4_);
                bVar41 = (bool)((byte)(uVar18 >> 6) & 1);
                fVar76 = (float)((uint)bVar41 * auVar54._24_4_ | (uint)!bVar41 * auVar57._24_4_);
                bVar41 = SUB81(uVar18 >> 7,0);
                auVar23._4_4_ = fVar84 * fVar71;
                auVar23._0_4_ = fVar84 * fVar42;
                auVar23._8_4_ = fVar84 * fVar72;
                auVar23._12_4_ = fVar84 * fVar73;
                auVar23._16_4_ = fVar84 * fVar74;
                auVar23._20_4_ = fVar84 * fVar75;
                auVar23._24_4_ = fVar84 * fVar76;
                auVar23._28_4_ = fVar84;
                auVar44 = vfmadd213ps_fma(auVar89,auVar70,auVar23);
                auVar44 = vfmadd213ps_fma(auVar83,auVar69,ZEXT1632(auVar44));
                auVar48 = ZEXT1632(CONCAT412(auVar44._12_4_ + auVar44._12_4_,
                                             CONCAT48(auVar44._8_4_ + auVar44._8_4_,
                                                      CONCAT44(auVar44._4_4_ + auVar44._4_4_,
                                                               auVar44._0_4_ + auVar44._0_4_))));
                auVar90._0_4_ = auVar50._0_4_ * fVar42;
                auVar90._4_4_ = auVar50._4_4_ * fVar71;
                auVar90._8_4_ = auVar50._8_4_ * fVar72;
                auVar90._12_4_ = auVar50._12_4_ * fVar73;
                auVar90._16_4_ = auVar50._16_4_ * fVar74;
                auVar90._20_4_ = auVar50._20_4_ * fVar75;
                auVar90._24_4_ = auVar50._24_4_ * fVar76;
                auVar90._28_4_ = 0;
                auVar44 = vfmadd213ps_fma(auVar46,auVar70,auVar90);
                auVar43 = vfmadd213ps_fma(auVar45,auVar69,ZEXT1632(auVar44));
                auVar46 = vrcp14ps_avx512vl(auVar48);
                auVar45._8_4_ = 0x3f800000;
                auVar45._0_8_ = &DAT_3f8000003f800000;
                auVar45._12_4_ = 0x3f800000;
                auVar45._16_4_ = 0x3f800000;
                auVar45._20_4_ = 0x3f800000;
                auVar45._24_4_ = 0x3f800000;
                auVar45._28_4_ = 0x3f800000;
                auVar45 = vfnmadd213ps_avx512vl(auVar46,auVar48,auVar45);
                auVar44 = vfmadd132ps_fma(auVar45,auVar46,auVar46);
                local_1280 = ZEXT1632(CONCAT412(auVar44._12_4_ * (auVar43._12_4_ + auVar43._12_4_),
                                                CONCAT48(auVar44._8_4_ *
                                                         (auVar43._8_4_ + auVar43._8_4_),
                                                         CONCAT44(auVar44._4_4_ *
                                                                  (auVar43._4_4_ + auVar43._4_4_),
                                                                  auVar44._0_4_ *
                                                                  (auVar43._0_4_ + auVar43._0_4_))))
                                     );
                uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4 + 0x30);
                auVar20._4_4_ = uVar82;
                auVar20._0_4_ = uVar82;
                auVar20._8_4_ = uVar82;
                auVar20._12_4_ = uVar82;
                auVar20._16_4_ = uVar82;
                auVar20._20_4_ = uVar82;
                auVar20._24_4_ = uVar82;
                auVar20._28_4_ = uVar82;
                uVar17 = vcmpps_avx512vl(local_1280,auVar20,0xd);
                uVar82 = *(undefined4 *)(local_1628 + local_1630 * 4 + 0x80);
                auVar21._4_4_ = uVar82;
                auVar21._0_4_ = uVar82;
                auVar21._8_4_ = uVar82;
                auVar21._12_4_ = uVar82;
                auVar21._16_4_ = uVar82;
                auVar21._20_4_ = uVar82;
                auVar21._24_4_ = uVar82;
                auVar21._28_4_ = uVar82;
                uVar19 = vcmpps_avx512vl(local_1280,auVar21,2);
                local_12d8 = (byte)uVar17 & (byte)uVar19 & local_12d8;
                if (local_12d8 != 0) {
                  uVar17 = vcmpps_avx512vl(auVar48,_DAT_02020f00,4);
                  local_12d8 = local_12d8 & (byte)uVar17;
                  if (local_12d8 != 0) {
                    local_12e0 = &local_1675;
                    auVar45 = vsubps_avx(local_1300,auVar66);
                    auVar45 = vblendps_avx(auVar65,auVar45,0xf0);
                    auVar46 = vsubps_avx(local_1300,auVar65);
                    auVar46 = vblendps_avx(auVar66,auVar46,0xf0);
                    local_1260[0] = auVar69._0_4_ * 1.0;
                    local_1260[1] = auVar69._4_4_ * 1.0;
                    local_1260[2] = auVar69._8_4_ * 1.0;
                    local_1260[3] = auVar69._12_4_ * 1.0;
                    fStack_1250 = auVar69._16_4_ * -1.0;
                    fStack_124c = auVar69._20_4_ * -1.0;
                    fStack_1248 = auVar69._24_4_ * -1.0;
                    uStack_1244 = auVar69._28_4_;
                    local_1240[0] = auVar70._0_4_ * 1.0;
                    local_1240[1] = auVar70._4_4_ * 1.0;
                    local_1240[2] = auVar70._8_4_ * 1.0;
                    local_1240[3] = auVar70._12_4_ * 1.0;
                    fStack_1230 = auVar70._16_4_ * -1.0;
                    fStack_122c = auVar70._20_4_ * -1.0;
                    fStack_1228 = auVar70._24_4_ * -1.0;
                    uStack_1224 = auVar70._28_4_;
                    local_1220[0] = fVar42 * 1.0;
                    local_1220[1] = fVar71 * 1.0;
                    local_1220[2] = fVar72 * 1.0;
                    local_1220[3] = fVar73 * 1.0;
                    fStack_1210 = fVar74 * -1.0;
                    fStack_120c = fVar75 * -1.0;
                    fStack_1208 = fVar76 * -1.0;
                    uStack_1204 = (uint)bVar41 * auVar54._28_4_ | (uint)!bVar41 * auVar57._28_4_;
                    auVar48 = vpbroadcastd_avx512vl();
                    auVar48 = vpaddd_avx2(auVar48,_DAT_0205d4c0);
                    auVar49 = vpbroadcastd_avx512vl();
                    auVar49 = vpaddd_avx2(auVar49,_DAT_0205d4e0);
                    auVar80._0_4_ = (float)(int)(*(ushort *)(local_1660 + 8 + lVar32) - 1);
                    auVar80._4_12_ = auVar50._4_12_;
                    auVar13._12_4_ = 0;
                    auVar13._0_12_ = ZEXT812(0);
                    auVar43 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416((uint)auVar80._0_4_));
                    auVar44 = vfnmadd213ss_fma(auVar80,auVar43,SUB6416(ZEXT464(0x40000000),0));
                    fStack_1328 = auVar43._0_4_ * auVar44._0_4_;
                    auVar44 = vcvtsi2ss_avx512f(auVar58._0_16_,
                                                *(ushort *)(local_1660 + 10 + lVar32) - 1);
                    auVar43 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416(auVar44._0_4_));
                    auVar44 = vfnmadd213ss_fma(auVar44,auVar43,SUB6416(ZEXT464(0x40000000),0));
                    fStack_1308 = auVar43._0_4_ * auVar44._0_4_;
                    auVar48 = vcvtdq2ps_avx(auVar48);
                    fStack_1324 = auVar48._28_4_ + auVar45._28_4_;
                    local_1340 = (local_1300._0_4_ * auVar48._0_4_ + auVar45._0_4_) * fStack_1328;
                    fStack_133c = (local_1300._4_4_ * auVar48._4_4_ + auVar45._4_4_) * fStack_1328;
                    fStack_1338 = (local_1300._8_4_ * auVar48._8_4_ + auVar45._8_4_) * fStack_1328;
                    fStack_1334 = (local_1300._12_4_ * auVar48._12_4_ + auVar45._12_4_) *
                                  fStack_1328;
                    fStack_1330 = (local_1300._16_4_ * auVar48._16_4_ + auVar45._16_4_) *
                                  fStack_1328;
                    fStack_132c = (local_1300._20_4_ * auVar48._20_4_ + auVar45._20_4_) *
                                  fStack_1328;
                    fStack_1328 = (local_1300._24_4_ * auVar48._24_4_ + auVar45._24_4_) *
                                  fStack_1328;
                    auVar45 = vcvtdq2ps_avx(auVar49);
                    local_1320 = (local_1300._0_4_ * auVar45._0_4_ + auVar46._0_4_) * fStack_1308;
                    fStack_131c = (local_1300._4_4_ * auVar45._4_4_ + auVar46._4_4_) * fStack_1308;
                    fStack_1318 = (local_1300._8_4_ * auVar45._8_4_ + auVar46._8_4_) * fStack_1308;
                    fStack_1314 = (local_1300._12_4_ * auVar45._12_4_ + auVar46._12_4_) *
                                  fStack_1308;
                    fStack_1310 = (local_1300._16_4_ * auVar45._16_4_ + auVar46._16_4_) *
                                  fStack_1308;
                    fStack_130c = (local_1300._20_4_ * auVar45._20_4_ + auVar46._20_4_) *
                                  fStack_1308;
                    fStack_1308 = (local_1300._24_4_ * auVar45._24_4_ + auVar46._24_4_) *
                                  fStack_1308;
                    fStack_1304 = auVar45._28_4_ + auVar46._28_4_;
                    pGVar8 = (context->scene->geometries).items[*(uint *)(local_15a0 + 0x88)].ptr;
                    if ((pGVar8->mask & *(uint *)(local_1628 + local_1630 * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00870ba9:
                        auVar104 = ZEXT3264(local_1460);
                        auVar107 = ZEXT3264(local_1480);
                        fVar84 = local_1400;
                        fVar72 = fStack_13fc;
                        fVar73 = fStack_13f8;
                        fVar74 = fStack_13f4;
                        fVar75 = fStack_13f0;
                        fVar76 = fStack_13ec;
                        fVar88 = fStack_13e8;
                        fVar42 = local_1420;
                        fVar91 = fStack_141c;
                        fVar92 = fStack_1418;
                        fVar93 = fStack_1414;
                        fVar94 = fStack_1410;
                        fVar95 = fStack_140c;
                        fVar96 = fStack_1408;
                        fVar71 = local_1440;
                        fVar97 = fStack_143c;
                        fVar98 = fStack_1438;
                        fVar99 = fStack_1434;
                        fVar100 = fStack_1430;
                        fVar101 = fStack_142c;
                        fVar102 = fStack_1428;
                        goto LAB_00870bda;
                      }
                      auVar22._8_4_ = 0x219392ef;
                      auVar22._0_8_ = 0x219392ef219392ef;
                      auVar22._12_4_ = 0x219392ef;
                      auVar22._16_4_ = 0x219392ef;
                      auVar22._20_4_ = 0x219392ef;
                      auVar22._24_4_ = 0x219392ef;
                      auVar22._28_4_ = 0x219392ef;
                      uVar29 = vcmpps_avx512vl(local_1300,auVar22,5);
                      auVar45 = vrcp14ps_avx512vl(local_1300);
                      auVar81._8_4_ = 0x3f800000;
                      auVar81._0_8_ = &DAT_3f8000003f800000;
                      auVar81._12_4_ = 0x3f800000;
                      auVar81._16_4_ = 0x3f800000;
                      auVar81._20_4_ = 0x3f800000;
                      auVar81._24_4_ = 0x3f800000;
                      auVar81._28_4_ = 0x3f800000;
                      auVar44 = vfnmadd213ps_fma(local_1300,auVar45,auVar81);
                      auVar45 = vfmadd132ps_avx512vl(ZEXT1632(auVar44),auVar45,auVar45);
                      fVar84 = (float)((uint)((byte)uVar29 & 1) * auVar45._0_4_);
                      fVar42 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar45._4_4_);
                      fVar71 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar45._8_4_);
                      fVar72 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar45._12_4_);
                      fVar73 = (float)((uint)((byte)(uVar29 >> 4) & 1) * auVar45._16_4_);
                      fVar74 = (float)((uint)((byte)(uVar29 >> 5) & 1) * auVar45._20_4_);
                      fVar75 = (float)((uint)((byte)(uVar29 >> 6) & 1) * auVar45._24_4_);
                      auVar24._4_4_ = fStack_133c * fVar42;
                      auVar24._0_4_ = local_1340 * fVar84;
                      auVar24._8_4_ = fStack_1338 * fVar71;
                      auVar24._12_4_ = fStack_1334 * fVar72;
                      auVar24._16_4_ = fStack_1330 * fVar73;
                      auVar24._20_4_ = fStack_132c * fVar74;
                      auVar24._24_4_ = fStack_1328 * fVar75;
                      auVar24._28_4_ = fStack_1324;
                      local_12c0 = vminps_avx(auVar24,auVar81);
                      auVar25._4_4_ = fStack_131c * fVar42;
                      auVar25._0_4_ = local_1320 * fVar84;
                      auVar25._8_4_ = fStack_1318 * fVar71;
                      auVar25._12_4_ = fStack_1314 * fVar72;
                      auVar25._16_4_ = fStack_1310 * fVar73;
                      auVar25._20_4_ = fStack_130c * fVar74;
                      auVar25._24_4_ = fStack_1308 * fVar75;
                      auVar25._28_4_ = (uint)(byte)(uVar29 >> 7) * auVar45._28_4_;
                      local_12a0 = vminps_avx(auVar25,auVar81);
                      local_1668 = (ulong)local_12d8;
                      bVar41 = local_1668 == 0;
                      if (!bVar41) {
                        local_1658 = 0;
                        for (uVar29 = local_1668; (uVar29 & 1) == 0;
                            uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                          local_1658 = local_1658 + 1;
                        }
                        local_1610 = vpbroadcastd_avx512vl();
                        local_1620 = vpbroadcastd_avx512vl();
                        local_14c0 = auVar111._0_32_;
                        local_14e0 = auVar112._0_32_;
                        local_1500 = auVar113._0_32_;
                        local_1520 = auVar114._0_32_;
                        local_1540 = auVar115._0_32_;
                        local_1560 = auVar116._0_32_;
                        do {
                          local_1674 = CONCAT31(local_1674._1_3_,bVar41);
                          uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_13a0 = *(undefined4 *)(local_12c0 + local_1658 * 4);
                          local_1390 = *(undefined4 *)(local_12a0 + local_1658 * 4);
                          *(float *)(ray + k * 4 + 0x80) = local_1260[local_1658 - 8];
                          local_1590.context = context->user;
                          local_13d0 = local_1260[local_1658];
                          local_13c0 = local_1240[local_1658];
                          local_13b0 = local_1220[local_1658];
                          local_1380 = local_1620._0_8_;
                          uStack_1378 = local_1620._8_8_;
                          local_1370 = local_1610;
                          vpcmpeqd_avx2(ZEXT1632(local_1610),ZEXT1632(local_1610));
                          uStack_135c = (local_1590.context)->instID[0];
                          local_1360 = uStack_135c;
                          uStack_1358 = uStack_135c;
                          uStack_1354 = uStack_135c;
                          uStack_1350 = (local_1590.context)->instPrimID[0];
                          uStack_134c = uStack_1350;
                          uStack_1348 = uStack_1350;
                          uStack_1344 = uStack_1350;
                          local_1600 = local_1490._0_8_;
                          uStack_15f8 = local_1490._8_8_;
                          local_1590.valid = (int *)&local_1600;
                          local_1590.geometryUserPtr = pGVar8->userPtr;
                          local_1590.hit = (RTCHitN *)&local_13d0;
                          local_1590.N = 4;
                          local_1660 = CONCAT44(local_1660._4_4_,uVar82);
                          local_1590.ray = (RTCRayN *)ray;
                          fStack_13cc = local_13d0;
                          fStack_13c8 = local_13d0;
                          fStack_13c4 = local_13d0;
                          fStack_13bc = local_13c0;
                          fStack_13b8 = local_13c0;
                          fStack_13b4 = local_13c0;
                          fStack_13ac = local_13b0;
                          fStack_13a8 = local_13b0;
                          fStack_13a4 = local_13b0;
                          uStack_139c = local_13a0;
                          uStack_1398 = local_13a0;
                          uStack_1394 = local_13a0;
                          uStack_138c = local_1390;
                          uStack_1388 = local_1390;
                          uStack_1384 = local_1390;
                          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar8->occlusionFilterN)(&local_1590);
                            uVar28 = local_1638;
                            k = local_1630;
                            uVar33 = local_1640;
                            ray = local_1628;
                            uVar35 = local_1648;
                            uVar36 = local_1650;
                            uVar82 = (undefined4)local_1660;
                          }
                          auVar14._8_8_ = uStack_15f8;
                          auVar14._0_8_ = local_1600;
                          uVar29 = vptestmd_avx512vl(auVar14,auVar14);
                          if ((uVar29 & 0xf) == 0) {
                            auVar111 = ZEXT3264(local_14c0);
                            auVar112 = ZEXT3264(local_14e0);
                            auVar113 = ZEXT3264(local_1500);
                            auVar114 = ZEXT3264(local_1520);
                            auVar115 = ZEXT3264(local_1540);
                            auVar116 = ZEXT3264(local_1560);
                          }
                          else {
                            p_Var9 = context->args->filter;
                            auVar111 = ZEXT3264(local_14c0);
                            auVar112 = ZEXT3264(local_14e0);
                            auVar113 = ZEXT3264(local_1500);
                            auVar114 = ZEXT3264(local_1520);
                            auVar115 = ZEXT3264(local_1540);
                            auVar116 = ZEXT3264(local_1560);
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var9)(&local_1590);
                              auVar116 = ZEXT3264(local_1560);
                              auVar115 = ZEXT3264(local_1540);
                              auVar114 = ZEXT3264(local_1520);
                              auVar113 = ZEXT3264(local_1500);
                              auVar112 = ZEXT3264(local_14e0);
                              auVar111 = ZEXT3264(local_14c0);
                              uVar28 = local_1638;
                              k = local_1630;
                              uVar33 = local_1640;
                              ray = local_1628;
                              uVar35 = local_1648;
                              uVar36 = local_1650;
                              uVar82 = (undefined4)local_1660;
                            }
                            auVar15._8_8_ = uStack_15f8;
                            auVar15._0_8_ = local_1600;
                            uVar29 = vptestmd_avx512vl(auVar15,auVar15);
                            uVar29 = uVar29 & 0xf;
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar41 = (bool)((byte)uVar29 & 1);
                            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
                            bVar12 = SUB81(uVar29 >> 3,0);
                            *(uint *)(local_1590.ray + 0x80) =
                                 (uint)bVar41 * auVar44._0_4_ |
                                 (uint)!bVar41 * *(int *)(local_1590.ray + 0x80);
                            *(uint *)(local_1590.ray + 0x84) =
                                 (uint)bVar10 * auVar44._4_4_ |
                                 (uint)!bVar10 * *(int *)(local_1590.ray + 0x84);
                            *(uint *)(local_1590.ray + 0x88) =
                                 (uint)bVar11 * auVar44._8_4_ |
                                 (uint)!bVar11 * *(int *)(local_1590.ray + 0x88);
                            *(uint *)(local_1590.ray + 0x8c) =
                                 (uint)bVar12 * auVar44._12_4_ |
                                 (uint)!bVar12 * *(int *)(local_1590.ray + 0x8c);
                            if ((byte)uVar29 != 0) {
                              if ((local_1674 & 1) == 0) goto LAB_00870ba9;
                              break;
                            }
                          }
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar82;
                          uVar29 = local_1658 & 0x3f;
                          local_1658 = 0;
                          local_1668 = local_1668 ^ 1L << uVar29;
                          for (uVar29 = local_1668; (uVar29 & 1) == 0;
                              uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                            local_1658 = local_1658 + 1;
                          }
                          bVar41 = local_1668 == 0;
                        } while (!bVar41);
                      }
                    }
                  }
                }
              }
              local_15b0 = local_15b0 - 1 & local_15b0;
              auVar104 = ZEXT3264(local_1460);
              auVar107 = ZEXT3264(local_1480);
              fVar84 = local_1400;
              fVar72 = fStack_13fc;
              fVar73 = fStack_13f8;
              fVar74 = fStack_13f4;
              fVar75 = fStack_13f0;
              fVar76 = fStack_13ec;
              fVar88 = fStack_13e8;
              fVar42 = local_1420;
              fVar91 = fStack_141c;
              fVar92 = fStack_1418;
              fVar93 = fStack_1414;
              fVar94 = fStack_1410;
              fVar95 = fStack_140c;
              fVar96 = fStack_1408;
              fVar71 = local_1440;
              fVar97 = fStack_143c;
              fVar98 = fStack_1438;
              fVar99 = fStack_1434;
              fVar100 = fStack_1430;
              fVar101 = fStack_142c;
              fVar102 = fStack_1428;
            } while (local_15b0 != 0);
          }
          local_15a8 = local_15a8 + 1;
          bVar40 = local_15a8 < local_15e8;
        } while (local_15a8 != local_15e8);
      }
LAB_00870bda:
      uVar26 = 0;
      if (bVar40) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar26 = 1;
      }
    }
  } while ((uVar26 & 3) == 0);
  return local_1598 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }